

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QStringList * getQtLibsFromElf(Options *options,QString *fileName)

{
  QLatin1StringView str;
  QAnyStringView s;
  QAnyStringView s_00;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *pcVar6;
  QString *in_RDX;
  long in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  bool readLibs;
  QString libraryName;
  const_iterator it;
  QString library;
  QByteArray line;
  QStringList ret;
  UP readElfCommand;
  QString readElf;
  char buffer [512];
  ArgBase *argBases [3];
  int in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa8c;
  FILE *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffa98;
  byte in_stack_fffffffffffffa9f;
  QAnyStringView *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  byte in_stack_fffffffffffffaaf;
  Options *in_stack_fffffffffffffab8;
  bool local_51d;
  int local_51c;
  undefined1 local_4c8 [32];
  Options *in_stack_fffffffffffffb60;
  undefined1 local_3f8 [24];
  piter local_3e0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_348;
  QLatin1StringView local_310;
  undefined1 local_300 [48];
  QString local_2d0;
  undefined1 local_2a8 [40];
  undefined1 local_280 [24];
  qsizetype local_268;
  char *local_260;
  ulong local_258;
  ArgBase **local_250;
  ulong local_248;
  ArgBase **local_240;
  ulong local_238;
  ArgBase **local_230;
  char local_228 [512];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_2d0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_2d0.d.size = -0x5555555555555556;
  llvmReadobjPath(in_stack_fffffffffffffab8);
  uVar3 = QFile::exists((QString *)&local_2d0);
  pFVar5 = _stderr;
  if ((uVar3 & 1) == 0) {
    QtPrivate::asString(&local_2d0);
    QString::toLocal8Bit((QString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    pcVar4 = QByteArray::constData((QByteArray *)0x120dd5);
    fprintf(pFVar5,"Command does not exist: %s\n",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x120df8);
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x120e13);
  }
  else {
    local_310 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),
                           (size_t)in_stack_fffffffffffffa90);
    shellQuote((QString *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    shellQuote((QString *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    local_268 = local_310.m_size;
    local_260 = local_310.m_data;
    str.m_data._0_7_ = in_stack_fffffffffffffaa8;
    str.m_size = (qsizetype)in_stack_fffffffffffffaa0;
    str.m_data._7_1_ = in_stack_fffffffffffffaaf;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),str);
    QAnyStringView::QAnyStringView
              (in_stack_fffffffffffffaa0,
               (QString *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    s.m_size._0_7_ = in_stack_fffffffffffffaa8;
    s.field_0.m_data = in_stack_fffffffffffffaa0;
    s.m_size._7_1_ = in_stack_fffffffffffffaaf;
    QtPrivate::qStringLikeToArg(s);
    QAnyStringView::QAnyStringView
              (in_stack_fffffffffffffaa0,
               (QString *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
    s_00.m_size._0_7_ = in_stack_fffffffffffffaa8;
    s_00.field_0.m_data = in_stack_fffffffffffffaa0;
    s_00.m_size._7_1_ = in_stack_fffffffffffffaaf;
    QtPrivate::qStringLikeToArg(s_00);
    local_238 = local_258;
    local_230 = local_250;
    local_28 = local_280;
    local_20 = local_2a8;
    local_18 = 0;
    local_248 = local_258;
    local_240 = local_250;
    QtPrivate::argToQString((QAnyStringView *)local_300,local_258,local_250);
    QString::operator=((QString *)in_stack_fffffffffffffa90,
                       (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    QString::~QString((QString *)0x121057);
    QString::~QString((QString *)0x121064);
    QString::~QString((QString *)0x121071);
    local_348 = 0xaaaaaaaaaaaaaaaa;
    openProcess((QString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr<_IO_FILE,_Closer> *)0x1210a2);
    pFVar5 = _stderr;
    if (bVar1) {
      local_378 = 0xaaaaaaaaaaaaaaaa;
      local_370 = 0xaaaaaaaaaaaaaaaa;
      local_368 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x121168);
      local_51d = false;
      memset(local_228,0xaa,0x200);
      do {
        pcVar4 = local_228;
        pFVar5 = (FILE *)std::unique_ptr<_IO_FILE,_Closer>::get
                                   ((unique_ptr<_IO_FILE,_Closer> *)0x12119e);
        pcVar6 = fgets(pcVar4,0x200,pFVar5);
        if (pcVar6 == (char *)0x0) {
          QList<QString>::QList
                    ((QList<QString> *)in_stack_fffffffffffffa90,
                     (QList<QString> *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                    );
          break;
        }
        local_390 = 0xaaaaaaaaaaaaaaaa;
        local_388 = 0xaaaaaaaaaaaaaaaa;
        local_380 = 0xaaaaaaaaaaaaaaaa;
        pcVar6 = local_228;
        qstrlen((char *)in_stack_fffffffffffffa90);
        QByteArray::fromRawData
                  ((char *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                   (qsizetype)in_stack_fffffffffffffaa0);
        local_3a8 = 0xaaaaaaaaaaaaaaaa;
        local_3a0 = 0xaaaaaaaaaaaaaaaa;
        local_398 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x121250);
        QByteArray::trimmed((QByteArray *)
                            CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffa90,
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        QByteArray::~QByteArray((QByteArray *)0x121287);
        if (local_51d == false) {
          QByteArrayView::QByteArrayView<7ul>
                    ((QByteArrayView *)in_stack_fffffffffffffaa0,
                     (char (*) [7])CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          bv.m_data = pcVar4;
          bv.m_size = (qsizetype)pcVar6;
          bVar1 = QByteArray::startsWith
                            ((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),bv);
          if (bVar1) {
            local_3e0.bucket = 0xaaaaaaaaaaaaaaaa;
            local_3e0.d = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0xaaaaaaaaaaaaaaaa;
            QByteArray::mid((longlong)local_3f8,(longlong)&local_390);
            local_3e0 = (piter)QHash<QByteArray,_QByteArray>::find
                                         ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffa90
                                          ,(QByteArray *)
                                           CONCAT44(in_stack_fffffffffffffa8c,
                                                    in_stack_fffffffffffffa88));
            QByteArray::~QByteArray((QByteArray *)0x12133c);
            QHash<QByteArray,_QByteArray>::constEnd
                      ((QHash<QByteArray,_QByteArray> *)
                       CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
            bVar1 = QHash<QByteArray,_QByteArray>::const_iterator::operator==
                              ((const_iterator *)
                               CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),
                               (const_iterator *)in_stack_fffffffffffffa90);
            in_stack_fffffffffffffa9f = 1;
            in_stack_fffffffffffffaaf = in_stack_fffffffffffffa9f;
            if (!bVar1) {
              in_stack_fffffffffffffaa0 =
                   (QAnyStringView *)
                   QHash<QByteArray,_QByteArray>::const_iterator::operator*
                             ((const_iterator *)0x12138c);
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              in_stack_fffffffffffffa9f =
                   operator!=((QByteArray *)
                              CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffaa8),
                              (QByteArray *)in_stack_fffffffffffffaa0);
              in_stack_fffffffffffffaaf = in_stack_fffffffffffffa9f;
              QByteArray::~QByteArray((QByteArray *)0x1213e3);
            }
            if ((in_stack_fffffffffffffa9f & 1) != 0) {
              if ((*(byte *)(in_RSI + 1) & 1) != 0) {
                in_stack_fffffffffffffa90 = _stdout;
                QtPrivate::asString(in_RDX);
                QString::toLocal8Bit
                          ((QString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8))
                ;
                pcVar4 = QByteArray::constData((QByteArray *)0x121431);
                fprintf(in_stack_fffffffffffffa90,"Skipping \"%s\", architecture mismatch\n",pcVar4)
                ;
                QByteArray::~QByteArray((QByteArray *)0x121454);
              }
              memset(in_RDI,0,0x18);
              QList<QString>::QList((QList<QString> *)0x12146f);
              local_51c = 1;
              goto LAB_00121627;
            }
          }
          QByteArrayView::QByteArrayView<16ul>
                    ((QByteArrayView *)in_stack_fffffffffffffaa0,
                     (char (*) [16])CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          bv_00.m_data = pcVar4;
          bv_00.m_size = (qsizetype)pcVar6;
          local_51d = QByteArray::startsWith
                                ((QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),bv_00
                                );
          local_51c = 2;
        }
        else {
          QByteArrayView::QByteArrayView<4ul>
                    ((QByteArrayView *)in_stack_fffffffffffffaa0,
                     (char (*) [4])CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          bv_01.m_data = pcVar4;
          bv_01.m_size = (qsizetype)pcVar6;
          bVar1 = QByteArray::startsWith
                            ((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),bv_01);
          if (bVar1) {
            QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffa90);
            QString::operator=((QString *)in_stack_fffffffffffffa90,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            QString::~QString((QString *)0x12153b);
            join_0x00000010_0x00000000_ =
                 Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98),
                            (size_t)in_stack_fffffffffffffa90);
            operator+((QLatin1String *)in_stack_fffffffffffffa90,
                      (QString *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QLatin1String,_QString_&> *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            absoluteFilePath(in_stack_fffffffffffffb60,local_4c8._32_8_);
            uVar2 = QFile::exists((QString *)local_4c8);
            in_stack_fffffffffffffa8c = CONCAT13(uVar2,(int3)in_stack_fffffffffffffa8c);
            QString::~QString((QString *)0x1215f3);
            if ((in_stack_fffffffffffffa8c & 0x1000000) != 0) {
              QList<QString>::operator+=
                        ((QList<QString> *)in_stack_fffffffffffffa90,
                         (parameter_type)
                         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            }
            QString::~QString((QString *)0x12161f);
            local_51c = 0;
          }
          else {
            local_51c = 2;
          }
        }
LAB_00121627:
        QString::~QString((QString *)0x121634);
        QByteArray::~QByteArray((QByteArray *)0x121641);
        in_stack_fffffffffffffa88 = local_51c;
      } while ((local_51c == 0) || (local_51c == 2));
      QList<QString>::~QList((QList<QString> *)0x121688);
    }
    else {
      QtPrivate::asString(&local_2d0);
      QString::toLocal8Bit((QString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8))
      ;
      pcVar4 = QByteArray::constData((QByteArray *)0x1210e3);
      fprintf(pFVar5,"Cannot execute command %s\n",pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x121106);
      memset(in_RDI,0,0x18);
      QList<QString>::QList((QList<QString> *)0x121121);
    }
    std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr
              ((unique_ptr<_IO_FILE,_Closer> *)in_stack_fffffffffffffa90);
  }
  QString::~QString((QString *)0x1216a2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList getQtLibsFromElf(const Options &options, const QString &fileName)
{
    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return QStringList();
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(fileName));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return QStringList();
    }

    QStringList ret;

    bool readLibs = false;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        QString library;
        line = line.trimmed();
        if (!readLibs) {
            if (line.startsWith("Arch: ")) {
                auto it = elfArchitectures.find(line.mid(6));
                if (it == elfArchitectures.constEnd() || *it != options.currentArchitecture.toLatin1()) {
                    if (options.verbose)
                        fprintf(stdout, "Skipping \"%s\", architecture mismatch\n", qPrintable(fileName));
                    return {};
                }
            }
            readLibs = line.startsWith("NeededLibraries");
            continue;
        }
        if (!line.startsWith("lib"))
            continue;
        library = QString::fromLatin1(line);
        QString libraryName = "lib/"_L1 + library;
        if (QFile::exists(absoluteFilePath(&options, libraryName)))
            ret += libraryName;
    }

    return ret;
}